

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

TLetter Cipher::decode(TClusters *t,int idx,TClusterToLetterMap *clMap,THint *hint)

{
  mapped_type *pmVar1;
  size_type sVar2;
  const_reference pvVar3;
  vector<int,_std::allocator<int>_> *in_RCX;
  key_type_conflict *in_RDX;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  mapped_type let;
  value_type *cid;
  undefined4 local_2c;
  undefined4 in_stack_fffffffffffffff0;
  
  std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)in_ESI);
  pmVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  local_2c = *pmVar1;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  if (in_ESI < (int)sVar2) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)in_ESI);
    if (*pvVar3 != -1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)in_ESI);
      local_2c = *pvVar3;
    }
  }
  return local_2c;
}

Assistant:

TLetter decode(const TClusters & t, int idx, const TClusterToLetterMap & clMap, const THint & hint) {
        const auto & cid = t[idx];
        auto let = clMap.at(cid);
        if ((int) hint.size() > idx && hint[idx] != -1) {
            let = hint[idx];
        }

        return let;
    }